

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::
writeImageSamplerDescriptorSetWithTemplate
          (ImageSampleComputeInstance *this,VkDescriptorSet descriptorSet,
          VkDescriptorSetLayout layout,bool withPush,VkPipelineLayout pipelineLayout)

{
  RawUpdateRegistry *this_00;
  ShaderInputInterface SVar1;
  undefined7 in_register_00000009;
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  updateEntries;
  VkDescriptorUpdateTemplateEntryKHR updateBinding;
  RefBase<vk::Handle<(vk::HandleType)32>_> local_d8;
  VkDescriptorImageInfo imageSamplers [2];
  VkDescriptorBufferInfo resultInfo;
  VkDescriptorUpdateTemplateCreateInfoKHR local_68;
  
  updateEntries.
  super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  updateEntries.
  super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  updateEntries.
  super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resultInfo.buffer.m_internal =
       (this->m_result).m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  resultInfo.offset = 0;
  resultInfo.range = 0x40;
  if (this->m_isImmutableSampler == true && !withPush) {
    imageSamplers[0].sampler.m_internal = 0;
    imageSamplers[1].sampler.m_internal = 0;
  }
  else {
    imageSamplers[0].sampler.m_internal =
         (this->m_images).m_samplerA.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
         m_internal;
    imageSamplers[1].sampler.m_internal =
         (this->m_images).m_samplerB.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
         m_internal;
  }
  imageSamplers[0].imageView.m_internal =
       (this->m_images).super_ImageInstanceImages.m_imageViewA.
       super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  imageSamplers[0].imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  imageSamplers[1].imageView.m_internal =
       (this->m_images).super_ImageInstanceImages.m_imageViewB.
       super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_68.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68.descriptorUpdateEntryCount = 0;
  local_68.pDescriptorUpdateEntries = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_68.templateType = (VkDescriptorUpdateTemplateTypeKHR)CONCAT71(in_register_00000009,withPush)
  ;
  local_68.pipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
  local_68.set = 0;
  this_00 = &this->m_updateRegistry;
  imageSamplers[1].imageLayout = imageSamplers[0].imageLayout;
  local_68.descriptorSetLayout.m_internal = layout.m_internal;
  local_68.pipelineLayout.m_internal = pipelineLayout.m_internal;
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>(this_00,&resultInfo);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>(this_00,imageSamplers);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>(this_00,imageSamplers + 1);
  updateBinding.offset =
       *(this->m_updateRegistry).m_updateEntryOffsets.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start;
  updateBinding.dstBinding = 0;
  updateBinding.dstArrayElement = 0;
  updateBinding.descriptorCount = 1;
  updateBinding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  updateBinding.stride = 0;
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::push_back(&updateEntries,&updateBinding);
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    updateBinding.offset =
         (this->m_updateRegistry).m_updateEntryOffsets.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    updateBinding.dstBinding = 1;
    updateBinding.dstArrayElement = 0;
    updateBinding.descriptorCount = 1;
    updateBinding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    updateBinding.stride = 0;
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back(&updateEntries,&updateBinding);
  }
  else if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    updateBinding.offset =
         (this->m_updateRegistry).m_updateEntryOffsets.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    updateBinding.dstBinding = 1;
    updateBinding.dstArrayElement = 0;
    updateBinding.descriptorCount = 1;
    updateBinding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    updateBinding.stride = 0;
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back(&updateEntries,&updateBinding);
    updateBinding.offset =
         (this->m_updateRegistry).m_updateEntryOffsets.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[2];
    updateBinding.dstBinding = 2;
    updateBinding.dstArrayElement = 0;
    updateBinding.descriptorCount = 1;
    updateBinding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    updateBinding.stride = 0;
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back(&updateEntries,&updateBinding);
  }
  else if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    updateBinding.offset =
         (this->m_updateRegistry).m_updateEntryOffsets.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    updateBinding.dstBinding = 1;
    updateBinding.dstArrayElement = 0;
    updateBinding.descriptorCount = 2;
    updateBinding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    updateBinding.stride = 0x18;
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back(&updateEntries,&updateBinding);
  }
  local_68.pDescriptorUpdateEntries =
       updateEntries.
       super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.descriptorUpdateEntryCount =
       (deUint32)
       ((ulong)((long)updateEntries.
                      super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)updateEntries.
                     super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
  ::vk::createDescriptorUpdateTemplateKHR
            ((Move<vk::Handle<(vk::HandleType)32>_> *)&local_d8,this->m_vki,this->m_device,&local_68
             ,(VkAllocationCallbacks *)0x0);
  updateBinding.offset = (deUintptr)local_d8.m_data.deleter.m_device;
  updateBinding.stride = (deUintptr)local_d8.m_data.deleter.m_allocator;
  updateBinding.dstBinding = (undefined4)local_d8.m_data.object.m_internal;
  updateBinding.dstArrayElement = local_d8.m_data.object.m_internal._4_4_;
  updateBinding._8_8_ = local_d8.m_data.deleter.m_deviceIface;
  local_d8.m_data.object.m_internal = 0;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)32>_>::reset
            (&(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>);
  (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device =
       (VkDevice)updateBinding.offset;
  (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)updateBinding.stride;
  (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal =
       updateBinding._0_8_;
  (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)updateBinding._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)32>_>::~RefBase(&local_d8);
  if (!withPush) {
    (*this->m_vki->_vptr_DeviceInterface[0x92])
              (this->m_vki,this->m_device,descriptorSet.m_internal,
               (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object
               .m_internal,
               (this->m_updateRegistry).m_updateEntries.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  std::
  _Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::~_Vector_base(&updateEntries.
                   super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 );
  return;
}

Assistant:

void ImageSampleComputeInstance::writeImageSamplerDescriptorSetWithTemplate (vk::VkDescriptorSet descriptorSet, vk::VkDescriptorSetLayout layout, bool withPush, vk::VkPipelineLayout pipelineLayout)
{
	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	const vk::VkDescriptorBufferInfo						resultInfo			= vk::makeDescriptorBufferInfo(m_result.getBuffer(), 0u, (vk::VkDeviceSize)ComputeInstanceResultBuffer::DATA_SIZE);
	const vk::VkSampler										samplers[2]			=
	{
		(m_isImmutableSampler && !withPush) ? (0) : (m_images.getSamplerA()),
		(m_isImmutableSampler && !withPush) ? (0) : (m_images.getSamplerB()),
	};
	const vk::VkDescriptorImageInfo							imageSamplers[2]	=
	{
		makeDescriptorImageInfo(samplers[0], m_images.getImageViewA(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
		makeDescriptorImageInfo(samplers[1], m_images.getImageViewB(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	};
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// updateCount
		DE_NULL,	// pUpdates
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_COMPUTE,
		pipelineLayout,
		0
	};
	m_updateRegistry.addWriteObject(resultInfo);
	m_updateRegistry.addWriteObject(imageSamplers[0]);
	m_updateRegistry.addWriteObject(imageSamplers[1]);

	// result
	updateEntries.push_back(createTemplateBinding(0, 0, 1, vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, m_updateRegistry.getWriteObjectOffset(0), 0));

	// combined image samplers
	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(1, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, m_updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(1, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, m_updateRegistry.getWriteObjectOffset(1), 0));
			updateEntries.push_back(createTemplateBinding(2, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, m_updateRegistry.getWriteObjectOffset(2), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(1, 0, 2, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, m_updateRegistry.getWriteObjectOffset(1), sizeof(imageSamplers[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries		= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount	= (deUint32)updateEntries.size();

	m_updateTemplate								= vk::createDescriptorUpdateTemplateKHR(m_vki, m_device, &templateCreateInfo);

	if (!withPush)
	{
		m_vki.updateDescriptorSetWithTemplateKHR(m_device, descriptorSet, *m_updateTemplate, m_updateRegistry.getRawPointer());
	}
}